

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

void nn_hash_erase(nn_hash *self,nn_hash_item *item)

{
  uint uVar1;
  
  uVar1 = (item->key >> 0x10 ^ item->key ^ 0x3d) * 9;
  uVar1 = (uVar1 >> 4 ^ uVar1) * 0x27d4eb2d;
  nn_list_erase(self->array + (ulong)(uVar1 >> 0xf ^ uVar1) % (ulong)self->slots,&item->list);
  self->items = self->items - 1;
  return;
}

Assistant:

void nn_hash_erase (struct nn_hash *self, struct nn_hash_item *item)
{
    uint32_t slot;

    slot = nn_hash_key (item->key) % self->slots;
    nn_list_erase (&self->array [slot], &item->list);
	--self->items;
}